

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char * getSelectionString(Atom selection)

{
  int iVar1;
  Window WVar2;
  char *pcVar3;
  Atom in_RDI;
  char *string;
  size_t size;
  XEvent dummy;
  XEvent notification;
  unsigned_long bytesAfter;
  unsigned_long itemCount;
  int actualFormat;
  Atom actualType;
  char *data;
  size_t i;
  size_t targetCount;
  Atom targets [2];
  char **selectionString;
  double *in_stack_fffffffffffffdc8;
  Atom *source;
  long *plVar4;
  char *local_200;
  size_t local_1f8;
  undefined1 local_1f0 [192];
  undefined1 local_130 [32];
  undefined8 local_110;
  long local_f8;
  undefined1 local_70 [8];
  long local_68;
  undefined1 local_5c [4];
  Atom local_58;
  char *local_50;
  ulong local_48;
  undefined8 local_40;
  Atom local_38 [2];
  char **local_28;
  Atom local_20;
  char *local_18;
  
  local_38[0] = _glfw.x11.UTF8_STRING;
  local_38[1] = 0x1f;
  local_40 = 2;
  if (in_RDI == _glfw.x11.PRIMARY) {
    local_28 = &_glfw.x11.primarySelectionString;
  }
  else {
    local_28 = &_glfw.x11.clipboardString;
  }
  local_20 = in_RDI;
  WVar2 = XGetSelectionOwner(_glfw.x11.display,in_RDI);
  if (WVar2 == _glfw.x11.helperWindowHandle) {
    local_18 = *local_28;
  }
  else {
    free(*local_28);
    *local_28 = (char *)0x0;
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      XConvertSelection(_glfw.x11.display,local_20,local_38[local_48],_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar1 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,local_130),
            iVar1 == 0) {
        waitForX11Event(in_stack_fffffffffffffdc8);
      }
      if (local_f8 != 0) {
        XCheckIfEvent(_glfw.x11.display,local_1f0,isSelPropNewValueNotify,local_130);
        source = &local_58;
        plVar4 = &local_68;
        in_stack_fffffffffffffdc8 = (double *)0x0;
        XGetWindowProperty(_glfw.x11.display,local_110,local_f8,0,0x7fffffffffffffff,1,0,source,
                           local_5c,plVar4,local_70,&local_50);
        if (local_58 == _glfw.x11.INCR) {
          local_1f8 = 1;
          local_200 = (char *)0x0;
          do {
            while (iVar1 = XCheckIfEvent(_glfw.x11.display,local_1f0,isSelPropNewValueNotify,
                                         local_130), iVar1 == 0) {
              waitForX11Event(in_stack_fffffffffffffdc8);
            }
            XFree(local_50);
            plVar4 = &local_68;
            in_stack_fffffffffffffdc8 = (double *)0x0;
            XGetWindowProperty(_glfw.x11.display,local_110,local_f8,0,0x7fffffffffffffff,1,0,
                               &local_58,local_5c,plVar4,local_70,&local_50);
            if (local_68 != 0) {
              local_1f8 = local_68 + local_1f8;
              local_200 = (char *)realloc(local_200,local_1f8);
              local_200[(local_1f8 - local_68) + -1] = '\0';
              strcat(local_200,local_50);
            }
          } while (local_68 != 0);
          if (local_200 != (char *)0x0) {
            if (local_38[local_48] == 0x1f) {
              pcVar3 = convertLatin1toUTF8((char *)plVar4);
              *local_28 = pcVar3;
              free(local_200);
            }
            else {
              *local_28 = local_200;
            }
          }
        }
        else if (local_58 == local_38[local_48]) {
          if (local_38[local_48] == 0x1f) {
            pcVar3 = convertLatin1toUTF8((char *)plVar4);
            *local_28 = pcVar3;
          }
          else {
            pcVar3 = _glfw_strdup((char *)source);
            *local_28 = pcVar3;
          }
        }
        XFree(local_50);
        if (*local_28 != (char *)0x0) break;
      }
    }
    if (*local_28 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
    }
    local_18 = *local_28;
  }
  return local_18;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForX11Event(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForX11Event(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (string)
                    {
                        if (targets[i] == XA_STRING)
                        {
                            *selectionString = convertLatin1toUTF8(string);
                            free(string);
                        }
                        else
                            *selectionString = string;
                    }

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}